

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O1

_Bool ransac(Correspondence *matched_points,int npoints,TransformationType type,
            MotionModel *motion_models,int num_desired_motions,_Bool *mem_alloc_failed)

{
  ulong uVar1;
  double *pdVar2;
  FindTransformationFunc p_Var3;
  int *piVar4;
  double dVar5;
  _Bool _Var6;
  int i;
  uint uVar7;
  ulong uVar8;
  int *__base;
  ulong uVar9;
  int *piVar10;
  int iVar11;
  double dVar12;
  undefined7 in_register_00000011;
  void *pvVar13;
  int *piVar14;
  MotionModel *pMVar15;
  bool bVar16;
  int trial_count;
  int iVar17;
  long lVar18;
  MotionModel *pMVar19;
  long lVar20;
  ulong uVar21;
  RANSAC_MOTION *motion_a;
  int *piVar22;
  int refine_count;
  uint uVar23;
  bool bVar24;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  RANSAC_MOTION current_motion;
  int indices [4];
  double params_this_motion [6];
  RANSAC_MOTION local_f8;
  void *local_d8;
  double local_d0;
  RansacModelInfo *local_c8;
  undefined4 local_bc;
  double local_b8;
  double dStack_b0;
  MotionModel *local_a8;
  Correspondence *local_a0;
  int local_98 [4];
  undefined1 local_88 [16];
  MotionModel *local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  dVar12 = (double)(ulong)(uint)num_desired_motions;
  uVar8 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  uVar23 = ransac_model_info[uVar8].minpts;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  if (0 < num_desired_motions) {
    lVar20 = 0;
    do {
      pdVar2 = (double *)((long)motion_models->params + lVar20 + 0x20);
      *pdVar2 = 0.0;
      pdVar2[1] = 1.0;
      pdVar2 = (double *)((long)motion_models->params + lVar20 + 0x10);
      *pdVar2 = 1.0;
      pdVar2[1] = 0.0;
      pdVar2 = (double *)((long)motion_models->params + lVar20);
      *pdVar2 = 0.0;
      pdVar2[1] = 0.0;
      *(undefined4 *)((long)motion_models->params + lVar20 + 0x38) = 0;
      lVar20 = lVar20 + 0x40;
    } while ((long)dVar12 << 6 != lVar20);
  }
  local_bc = 0;
  if ((npoints != 0) && (local_bc = 0, (int)(uVar23 * 5) <= npoints)) {
    uVar7 = (int)((double)npoints * 0.1);
    if ((int)((double)npoints * 0.1) < (int)uVar23) {
      uVar7 = uVar23;
    }
    local_88._0_4_ = uVar7;
    local_a8 = motion_models;
    __base = (int *)aom_calloc((long)num_desired_motions,0x18);
    local_d8 = aom_malloc((long)(num_desired_motions + 1) * (long)npoints * 4);
    local_bc = (undefined4)
               CONCAT71((int7)((ulong)motion_models >> 8),
                        local_d8 != (void *)0x0 && __base != (int *)0x0);
    if (local_d8 != (void *)0x0 && __base != (int *)0x0) {
      local_c8 = ransac_model_info + uVar8;
      if (0 < num_desired_motions) {
        lVar20 = 0;
        pvVar13 = local_d8;
        do {
          *(void **)((long)__base + lVar20 + 0x10) = pvVar13;
          lVar20 = lVar20 + 0x18;
          pvVar13 = (void *)((long)pvVar13 + (long)npoints * 4);
        } while ((long)dVar12 * 0x18 != lVar20);
      }
      local_f8.num_inliers = 0;
      local_f8._4_4_ = 0;
      local_f8.sse = 0.0;
      local_f8.inlier_indices = (int *)((long)local_d8 + (long)(num_desired_motions * npoints) * 4);
      p_Var3 = local_c8->find_transformation;
      iVar17 = 0;
      uVar8 = (ulong)(uint)npoints;
      piVar14 = __base;
      local_d0 = dVar12;
      local_b8 = dVar12;
      local_a0 = matched_points;
      do {
        if (0 < (int)uVar23) {
          uVar9 = 0;
          do {
            uVar8 = (ulong)((int)uVar8 * 0x41c64e6d + 0x3039);
            lVar20 = uVar8 * (uint)npoints;
            iVar11 = (int)((ulong)lVar20 >> 0x20);
            if (uVar9 != 0) {
              do {
                iVar11 = (int)((ulong)lVar20 >> 0x20);
                if (local_98[0] != iVar11) {
                  uVar21 = 0;
                  do {
                    if (uVar9 - 1 == uVar21) goto LAB_0018d5a0;
                    uVar1 = uVar21 + 1;
                    lVar20 = uVar21 + 1;
                    uVar21 = uVar1;
                  } while (local_98[lVar20] != iVar11);
                  if (uVar9 <= uVar1) break;
                }
                uVar8 = (ulong)((int)uVar8 * 0x41c64e6d + 0x3039);
                lVar20 = uVar8 * (uint)npoints;
                iVar11 = (int)((ulong)lVar20 >> 0x20);
              } while (uVar9 != 0);
            }
LAB_0018d5a0:
            local_98[uVar9] = iVar11;
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar23);
        }
        _Var6 = (*p_Var3)(matched_points,local_98,uVar23,&local_68);
        matched_points = local_a0;
        if (_Var6) {
          (*local_c8->score_model)(&local_68,local_a0,npoints,&local_f8);
          if (((int)local_88._0_4_ <= local_f8.num_inliers) &&
             ((*piVar14 < local_f8.num_inliers ||
              ((*piVar14 <= local_f8.num_inliers && (local_f8.sse < *(double *)(piVar14 + 2))))))) {
            *piVar14 = local_f8.num_inliers;
            *(double *)(piVar14 + 2) = local_f8.sse;
            piVar4 = *(int **)(piVar14 + 4);
            *(int **)(piVar14 + 4) = local_f8.inlier_indices;
            piVar10 = __base;
            dVar12 = local_d0;
            piVar22 = piVar14;
            local_f8.inlier_indices = piVar4;
            if (0 < local_b8._0_4_) {
              do {
                piVar14 = piVar10;
                if ((*piVar22 <= *piVar10) &&
                   ((*piVar22 < *piVar10 ||
                    (*(double *)(piVar10 + 2) < *(double *)(piVar22 + 2) ||
                     *(double *)(piVar10 + 2) == *(double *)(piVar22 + 2))))) {
                  piVar14 = piVar22;
                }
                dVar12 = (double)((long)dVar12 + -1);
                piVar10 = piVar10 + 6;
                piVar22 = piVar14;
              } while (dVar12 != 0.0);
            }
          }
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != 0x14);
      qsort(__base,(long)num_desired_motions,0x18,compare_motions);
      if (0 < local_b8._0_4_) {
        dVar12 = 0.0;
        pMVar19 = local_a8;
        do {
          if (0 < __base[(long)dVar12 * 6]) {
            piVar14 = __base + (long)dVar12 * 6;
            bVar16 = false;
            uVar23 = 0;
            do {
              _Var6 = (*p_Var3)(matched_points,*(int **)(piVar14 + 4),*piVar14,&local_68);
              if (_Var6) {
                (*local_c8->score_model)(&local_68,matched_points,npoints,&local_f8);
                if (local_f8.num_inliers <= *piVar14) goto LAB_0018d760;
                *piVar14 = local_f8.num_inliers;
                *(double *)(piVar14 + 2) = local_f8.sse;
                piVar4 = *(int **)(piVar14 + 4);
                *(int **)(piVar14 + 4) = local_f8.inlier_indices;
                bVar24 = true;
                local_f8.inlier_indices = piVar4;
              }
              else {
                bVar16 = true;
LAB_0018d760:
                bVar24 = false;
              }
            } while ((bVar24) && (bVar24 = uVar23 < 4, uVar23 = uVar23 + 1, bVar24));
            if (!bVar16) {
              pMVar15 = pMVar19 + (long)dVar12;
              pMVar19[(long)dVar12].params[4] = local_48;
              (pMVar19[(long)dVar12].params + 4)[1] = dStack_40;
              pMVar19[(long)dVar12].params[2] = local_58;
              (pMVar19[(long)dVar12].params + 2)[1] = dStack_50;
              pMVar19[(long)dVar12].params[0] = local_68;
              pMVar19[(long)dVar12].params[1] = dStack_60;
              iVar17 = *piVar14;
              if (0 < iVar17) {
                lVar20 = *(long *)(piVar14 + 4);
                piVar4 = pMVar15->inliers;
                lVar18 = 0;
                local_70 = pMVar15;
                do {
                  local_b8 = matched_points[*(int *)(lVar20 + lVar18 * 4)].x;
                  dStack_b0 = matched_points[*(int *)(lVar20 + lVar18 * 4)].y;
                  dVar5 = rint(local_b8);
                  local_88._8_4_ = extraout_XMM0_Dc;
                  local_88._0_8_ = dVar5;
                  local_88._12_4_ = extraout_XMM0_Dd;
                  dVar5 = rint(dStack_b0);
                  *(ulong *)(piVar4 + lVar18 * 2) = CONCAT44((int)dVar5,(int)(double)local_88._0_8_)
                  ;
                  lVar18 = lVar18 + 1;
                  iVar17 = *piVar14;
                  pMVar15 = local_70;
                  pMVar19 = local_a8;
                } while (lVar18 < iVar17);
              }
              pMVar15->num_inliers = iVar17;
            }
          }
          dVar12 = (double)((long)dVar12 + 1);
        } while (dVar12 != local_d0);
      }
    }
    else {
      *mem_alloc_failed = true;
    }
    aom_free(local_d8);
    aom_free(__base);
  }
  return SUB41(local_bc,0);
}

Assistant:

bool ransac(const Correspondence *matched_points, int npoints,
            TransformationType type, MotionModel *motion_models,
            int num_desired_motions, bool *mem_alloc_failed) {
#if ALLOW_TRANSLATION_MODELS
  assert(type > IDENTITY && type < TRANS_TYPES);
#else
  assert(type > TRANSLATION && type < TRANS_TYPES);
#endif  // ALLOW_TRANSLATION_MODELS

  return ransac_internal(matched_points, npoints, motion_models,
                         num_desired_motions, &ransac_model_info[type],
                         mem_alloc_failed);
}